

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

char __thiscall llvm::yaml::Scanner::scanBlockChompingIndicator(Scanner *this)

{
  char cVar1;
  char cVar2;
  
  cVar2 = ' ';
  if ((this->Current != this->End) &&
     ((cVar1 = *this->Current, cVar1 == '-' || (cVar2 = ' ', cVar1 == '+')))) {
    skip(this,1);
    cVar2 = cVar1;
  }
  return cVar2;
}

Assistant:

char Scanner::scanBlockChompingIndicator() {
  char Indicator = ' ';
  if (Current != End && (*Current == '+' || *Current == '-')) {
    Indicator = *Current;
    skip(1);
  }
  return Indicator;
}